

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

int Scl_LibertySkipSpaces(Scl_Tree_t *p,char **ppPos,char *pEnd,int fStopAtNewLine)

{
  byte *pbVar1;
  byte bVar2;
  
  for (pbVar1 = (byte *)*ppPos; pbVar1 < pEnd; pbVar1 = pbVar1 + 1) {
    bVar2 = *pbVar1;
    if (bVar2 == 10) {
      p->nLines = p->nLines + 1;
      if (fStopAtNewLine != 0) break;
      bVar2 = *pbVar1;
    }
    if (((0x20 < bVar2) || ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) && (bVar2 != 0x5c))
    break;
  }
  *ppPos = (char *)pbVar1;
  return (int)(pbVar1 == (byte *)pEnd);
}

Assistant:

static inline int Scl_LibertySkipSpaces( Scl_Tree_t * p, char ** ppPos, char * pEnd, int fStopAtNewLine )
{
    char * pPos = *ppPos;
    for ( ; pPos < pEnd; pPos++ )
    {
        if ( *pPos == '\n' )
        {
            p->nLines++;
            if ( fStopAtNewLine )
                break;
        }        
        if ( !Scl_LibertyCharIsSpace(*pPos) )
            break;
    }
    *ppPos = pPos;
    return pPos == pEnd;
}